

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O3

string * __thiscall
glcts::(anonymous_namespace)::ImageSizeMachine::GenShader<tcu::Vector<float,4>>
          (string *__return_storage_ptr__,ImageSizeMachine *this,int stage)

{
  ostream *poVar1;
  string *psVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  ostringstream os;
  char local_298 [16];
  char *local_288;
  undefined8 local_280;
  char local_278;
  undefined7 uStack_277;
  char *local_268;
  undefined8 local_260;
  undefined2 local_258;
  undefined6 uStack_256;
  char *local_248;
  undefined8 local_240;
  char local_238;
  undefined7 uStack_237;
  char *local_228;
  undefined8 local_220;
  undefined2 local_218;
  undefined6 uStack_216;
  char *local_208;
  undefined8 local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  char *local_1e8;
  undefined8 local_1e0;
  undefined2 local_1d8;
  undefined6 uStack_1d6;
  char *local_1c8;
  undefined8 local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n#define KSIZE 4",0x10);
  iVar5 = (int)this;
  pcVar4 = "\nlayout(std430) buffer OutputBuffer {\n  ivec4 count[KSIZE];\n};";
  if (iVar5 == 0) {
    pcVar4 = "\nflat out ivec4 count[KSIZE];";
  }
  lVar3 = 0x3e;
  if (iVar5 == 0) {
    lVar3 = 0x1d;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\nlayout(binding = 0, rgba32",0x1b);
  local_228 = (char *)&local_218;
  local_218 = 0x66;
  local_220 = 1;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_228,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,") readonly writeonly uniform highp ",0x23);
  local_248 = &local_238;
  local_240 = 0;
  local_238 = '\0';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_248,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"image2D g_image_2d;\nlayout(binding = 1, rgba32",0x2e);
  local_268 = (char *)&local_258;
  local_258 = 0x66;
  local_260 = 1;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_268,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,") readonly writeonly uniform highp ",0x23);
  local_288 = &local_278;
  local_280 = 0;
  local_278 = '\0';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_288,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"image3D g_image_3d;\nlayout(binding = 2, rgba32",0x2e);
  local_298[0] = 'f';
  local_298[1] = '\0';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_298,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,") readonly writeonly uniform highp ",0x23);
  local_1c0 = 0;
  local_1b8 = '\0';
  local_1c8 = &local_1b8;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b8,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"imageCube g_image_cube;\nlayout(binding = 3, rgba32",0x32);
  local_1d8 = 0x66;
  local_1e0 = 1;
  local_1e8 = (char *)&local_1d8;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1d8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,") readonly writeonly uniform highp ",0x23);
  local_200 = 0;
  local_1f8 = '\0';
  local_208 = &local_1f8;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1f8,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"image2DArray g_image_2d_array;",0x1e);
  if (local_208 != &local_1f8) {
    operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
  }
  if (local_1e8 != (char *)&local_1d8) {
    operator_delete(local_1e8,CONCAT62(uStack_1d6,local_1d8) + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
  }
  if (local_268 != (char *)&local_258) {
    operator_delete(local_268,CONCAT62(uStack_256,local_258) + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,CONCAT71(uStack_237,local_238) + 1);
  }
  if (local_228 != (char *)&local_218) {
    operator_delete(local_228,CONCAT62(uStack_216,local_218) + 1);
  }
  if (iVar5 == 0) {
    lVar3 = 0x53;
    pcVar4 = 
    "\nvoid main() {\n  int coord = gl_VertexID;\n#ifdef GL_ES\n  gl_PointSize = 1.0;\n#endif";
  }
  else if (iVar5 == 4) {
    lVar3 = 0x57;
    pcVar4 = 
    "\nlayout(local_size_x = 1) in;\nvoid main() {\n  int coord = int(gl_GlobalInvocationID.x);";
  }
  else {
    if (iVar5 != 5) goto LAB_00c67d6c;
    lVar3 = 0x4a;
    pcVar4 = "\nuniform int fakePrimitiveID;\nvoid main() {\n  int coord = fakePrimitiveID;";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar4,lVar3);
LAB_00c67d6c:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\n  count[coord + 0] = ivec4(imageSize(g_image_2d), 0, 0);\n  count[coord + 1] = ivec4(imageSize(g_image_3d), 0);\n  count[coord + 2] = ivec4(imageSize(g_image_cube), 0, 0);\n  count[coord + 3] = ivec4(imageSize(g_image_2d_array), 0);\n}"
             ,0xe8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  psVar2 = (string *)std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar2;
}

Assistant:

std::string GenShader(int stage)
	{
		std::ostringstream os;
		os << NL "#define KSIZE 4";
		if (stage == 0)
		{ // VS uses transform feedback
			os << NL "flat out ivec4 count[KSIZE];";
		}
		else
		{ // CS + FS use SSBO
			os << NL "layout(std430) buffer OutputBuffer {" NL "  ivec4 count[KSIZE];" NL "};";
		}
		os << NL "layout(binding = 0, rgba32" << ImageFormatPostfix<T>() << ") readonly writeonly uniform highp "
		   << ImageTypePrefix<T>() << "image2D g_image_2d;" NL "layout(binding = 1, rgba32" << ImageFormatPostfix<T>()
		   << ") readonly writeonly uniform highp " << ImageTypePrefix<T>()
		   << "image3D g_image_3d;" NL "layout(binding = 2, rgba32" << ImageFormatPostfix<T>()
		   << ") readonly writeonly uniform highp " << ImageTypePrefix<T>()
		   << "imageCube g_image_cube;" NL "layout(binding = 3, rgba32" << ImageFormatPostfix<T>()
		   << ") readonly writeonly uniform highp " << ImageTypePrefix<T>() << "image2DArray g_image_2d_array;";
		if (stage == 0)
		{ // VS
			os << NL "void main() {" NL "  int coord = gl_VertexID;" NL "#ifdef GL_ES" NL "  gl_PointSize = 1.0;" NL
					 "#endif";
		}
		else if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = 1) in;" NL "void main() {" NL "  int coord = int(gl_GlobalInvocationID.x);";
		}
		else if (stage == 5)
		{ // FS
			os << NL "uniform int fakePrimitiveID;" NL "void main() {" NL "  int coord = fakePrimitiveID;";
		}
		os << NL "  count[coord + 0] = ivec4(imageSize(g_image_2d), 0, 0);" NL
				 "  count[coord + 1] = ivec4(imageSize(g_image_3d), 0);" NL
				 "  count[coord + 2] = ivec4(imageSize(g_image_cube), 0, 0);" NL
				 "  count[coord + 3] = ivec4(imageSize(g_image_2d_array), 0);" NL "}";
		return os.str();
	}